

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O0

void after_read(uv_stream_t *handle,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  void *pvVar2;
  int r;
  uv_shutdown_t *req;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *handle_local;
  
  if (buf->base != (char *)0x0) {
    free(buf->base);
  }
  pvVar2 = malloc(0x50);
  iVar1 = uv_shutdown(pvVar2,handle,after_shutdown);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-getsockname.c"
            ,0x4b,"r == 0");
    abort();
  }
  return;
}

Assistant:

static void after_read(uv_stream_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf) {
  int i;
  write_req_t *wr;
  uv_shutdown_t* sreq;
  int shutdown = 0;

  if (nread < 0) {
    /* Error or EOF */
    ASSERT_EQ(nread, UV_EOF);

    free(buf->base);
    sreq = malloc(sizeof* sreq);
    if (uv_is_writable(handle)) {
      ASSERT_EQ(0, uv_shutdown(sreq, handle, after_shutdown));
    }
    return;
  }

  if (nread == 0) {
    /* Everything OK, but nothing read. */
    free(buf->base);
    return;
  }

  /*
   * Scan for the letter Q which signals that we should quit the server.
   * If we get QS it means close the stream.
   * If we get QSS it means shutdown the stream.
   * If we get QSH it means disable linger before close the socket.
   */
  for (i = 0; i < nread; i++) {
    if (buf->base[i] == 'Q') {
      if (i + 1 < nread && buf->base[i + 1] == 'S') {
        int reset = 0;
        if (i + 2 < nread && buf->base[i + 2] == 'S')
          shutdown = 1;
        if (i + 2 < nread && buf->base[i + 2] == 'H')
          reset = 1;
        if (reset && handle->type == UV_TCP)
          ASSERT_EQ(0, uv_tcp_close_reset((uv_tcp_t*) handle, on_close));
        else if (shutdown)
          break;
        else
          uv_close((uv_handle_t*) handle, on_close);
        free(buf->base);
        return;
      } else if (!server_closed) {
        uv_close(server, on_server_close);
        server_closed = 1;
      }
    }
  }

  wr = (write_req_t*) malloc(sizeof *wr);
  ASSERT_NOT_NULL(wr);
  wr->buf = uv_buf_init(buf->base, nread);

  if (uv_write(&wr->req, handle, &wr->buf, 1, after_write)) {
    FATAL("uv_write failed");
  }

  if (shutdown)
    ASSERT_EQ(0, uv_shutdown(malloc(sizeof* sreq), handle, on_shutdown));
}